

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

bool __thiscall Minisat::SimpSolver::eliminate_(SimpSolver *this)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  uint *puVar4;
  uint *puVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  lbool local_46;
  lbool local_45;
  int local_44;
  Heap<Minisat::SimpSolver::ElimLt> *local_40;
  double local_38;
  
  local_38 = cpuTime();
  bVar6 = Solver::simplify(&this->super_Solver);
  if (bVar6) {
    bVar6 = true;
    if (this->use_simplification == true) {
      local_44 = (this->super_Solver).trail.sz;
      local_40 = &this->elim_heap;
      while( true ) {
        if ((((this->n_touched < 1) && ((this->super_Solver).trail.sz <= this->bwdsub_assigns)) &&
            ((this->elim_heap).heap.sz < 1)) ||
           ((this->max_simp_steps != 0xffffffffffffffff &&
            ((ulong)this->max_simp_steps <= (this->super_Solver).statistics.simpSteps))))
        goto LAB_00128004;
        gatherTouchedClauses(this);
        iVar8 = (this->subsumption_queue).end;
        iVar10 = 0;
        iVar9 = (this->subsumption_queue).first;
        iVar7 = iVar8 - iVar9;
        if (iVar8 < iVar9) {
          iVar10 = (this->subsumption_queue).buf.sz;
        }
        iVar8 = iVar7 + iVar10;
        if (((iVar8 != 0 && SCARRY4(iVar7,iVar10) == iVar8 < 0) ||
            (this->bwdsub_assigns < (this->super_Solver).trail.sz)) &&
           (bVar6 = backwardSubsumptionCheck(this,true), !bVar6)) break;
        if (((this->super_Solver).asynch_interrupt != false) ||
           ((this->max_simp_steps != 0xffffffffffffffff &&
            ((ulong)this->max_simp_steps <= (this->super_Solver).statistics.simpSteps)))) {
          Heap<Minisat::SimpSolver::ElimLt>::clear(local_40,false);
LAB_00128004:
          if (local_44 == (this->super_Solver).trail.sz) {
            puVar4 = (this->super_Solver).clauses.data;
            puVar5 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
            iVar8 = 0;
            for (lVar12 = 0; lVar12 < (this->super_Solver).clauses.sz; lVar12 = lVar12 + 1) {
              uVar2 = puVar4[lVar12];
              if ((puVar5[uVar2] & 3) == 0) {
                lVar13 = (long)iVar8;
                iVar8 = iVar8 + 1;
                puVar4[lVar13] = uVar2;
              }
            }
            vec<unsigned_int>::shrink(&(this->super_Solver).clauses,(int)lVar12 - iVar8);
          }
          else {
            removeSatisfied(this);
          }
          Solver::checkGarbage(&this->super_Solver);
          if ((0 < (this->super_Solver).verbosity) &&
             (lVar12 = (long)(this->elimclauses).sz, 0 < lVar12)) {
            printf("c |  Eliminated clauses:     %10.2f Mb                                      |\n"
                   ,(double)(lVar12 << 2) * 9.5367431640625e-07);
          }
          dVar14 = cpuTime();
          (this->super_Solver).statistics.simpSeconds =
               (dVar14 - local_38) + (this->super_Solver).statistics.simpSeconds;
          return (this->super_Solver).ok;
        }
        iVar8 = 0;
        uVar11 = 0;
        while( true ) {
          if ((((this->elim_heap).heap.sz == 0) ||
              (iVar9 = Heap<Minisat::SimpSolver::ElimLt>::removeMin(local_40),
              (this->super_Solver).asynch_interrupt != false)) ||
             ((this->max_simp_steps != 0xffffffffffffffff &&
              ((ulong)this->max_simp_steps <= (this->super_Solver).statistics.simpSteps)))) break;
          if ((this->eliminated).data[iVar9] == '\0') {
            local_45.value = (this->super_Solver).assigns.data[iVar9].value;
            bVar6 = lbool::operator!=(&local_45,(lbool)0x2);
            if (!bVar6) {
              if ((1 < (this->super_Solver).verbosity) && ((int)(uVar11 / 100) * 100 + iVar8 == 0))
              {
                printf("c elimination left: %10d\r");
              }
              if (this->use_asymm == true) {
                pcVar3 = (this->frozen).data;
                cVar1 = pcVar3[iVar9];
                pcVar3[iVar9] = '\x01';
                bVar6 = asymmVar(this,iVar9);
                if (!bVar6) goto LAB_00127ffd;
                (this->frozen).data[iVar9] = cVar1 != '\0';
              }
              if (this->use_elim == true) {
                local_46.value = (this->super_Solver).assigns.data[iVar9].value;
                bVar6 = lbool::operator==(&local_46,(lbool)0x2);
                if (((bVar6) && ((this->frozen).data[iVar9] == '\0')) &&
                   (bVar6 = eliminateVar(this,iVar9), !bVar6)) goto LAB_00127ffd;
              }
              Solver::checkGarbage(&this->super_Solver,this->simp_garbage_frac);
            }
          }
          uVar11 = (ulong)((int)uVar11 + 1);
          iVar8 = iVar8 + -1;
        }
      }
LAB_00127ffd:
      (this->super_Solver).ok = false;
      goto LAB_00128004;
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool SimpSolver::eliminate_()
{
    double simp_time = cpuTime();
    if (!simplify())
        return false;
    else if (!use_simplification)
        return true;

    int trail_size_last = trail.size();

    // Main simplification loop:
    //
    while (n_touched > 0 || bwdsub_assigns < trail.size() || elim_heap.size() > 0) {

        if (!isInSimpLimit()) break;

        gatherTouchedClauses();
        // printf("  ## (time = %6.2f s) BWD-SUB: queue = %d, trail = %d\n", cpuTime(), subsumption_queue.size(), trail.size() - bwdsub_assigns);
        if ((subsumption_queue.size() > 0 || bwdsub_assigns < trail.size()) && !backwardSubsumptionCheck(true)) {
            ok = false;
            goto cleanup;
        }

        // Empty elim_heap and return immediately on user-interrupt:
        if (asynch_interrupt || !isInSimpLimit()) {
            assert(bwdsub_assigns == trail.size());
            assert(subsumption_queue.size() == 0);
            assert(n_touched == 0);
            elim_heap.clear();
            goto cleanup;
        }

        // printf("  ## (time = %6.2f s) ELIM: vars = %d\n", cpuTime(), elim_heap.size());
        for (int cnt = 0; !elim_heap.empty(); cnt++) {
            Var elim = elim_heap.removeMin();

            if (asynch_interrupt || !isInSimpLimit()) break;

            if (isEliminated(elim) || value(elim) != l_Undef) continue;

            if (verbosity >= 2 && cnt % 100 == 0) printf("c elimination left: %10d\r", elim_heap.size());

            if (use_asymm) {
                // Temporarily freeze variable. Otherwise, it would immediately end up on the queue again:
                bool was_frozen = frozen[elim];
                frozen[elim] = true;
                if (!asymmVar(elim)) {
                    ok = false;
                    goto cleanup;
                }
                frozen[elim] = was_frozen;
            }

            // At this point, the variable may have been set by assymetric branching, so check it
            // again. Also, don't eliminate frozen variables:
            if (use_elim && value(elim) == l_Undef && !frozen[elim] && !eliminateVar(elim)) {
                ok = false;
                goto cleanup;
            }

            checkGarbage(simp_garbage_frac);
        }

        assert(subsumption_queue.size() == 0);
    }
cleanup:
    // To get an accurate number of clauses.
    if (trail_size_last != trail.size())
        removeSatisfied();
    else {
        int i, j;
        for (i = j = 0; i < clauses.size(); i++)
            if (ca[clauses[i]].mark() == 0) clauses[j++] = clauses[i];
        clauses.shrink(i - j);
    }
    checkGarbage();

    if (verbosity >= 1 && elimclauses.size() > 0)
        printf("c |  Eliminated clauses:     %10.2f Mb                                      |\n",
               double(elimclauses.size() * sizeof(uint32_t)) / (1024 * 1024));

    statistics.simpSeconds += cpuTime() - simp_time;

    return ok;
}